

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

XML_Convert_Result
latin1_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  byte bVar1;
  ushort *puVar2;
  byte *pbVar3;
  ushort *puVar4;
  
  pbVar3 = (byte *)*fromP;
  if (pbVar3 < fromLim) {
    puVar4 = *toP;
    do {
      if (toLim <= puVar4) {
        if (puVar4 != toLim) {
          return XML_CONVERT_COMPLETED;
        }
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      *fromP = (char *)(pbVar3 + 1);
      bVar1 = *pbVar3;
      puVar2 = *toP;
      puVar4 = puVar2 + 1;
      *toP = puVar4;
      *puVar2 = (ushort)bVar1;
      pbVar3 = (byte *)*fromP;
    } while (pbVar3 < fromLim);
  }
  return XML_CONVERT_COMPLETED;
}

Assistant:

static enum XML_Convert_Result PTRCALL
latin1_toUtf16(const ENCODING *enc, const char **fromP, const char *fromLim,
               unsigned short **toP, const unsigned short *toLim) {
  UNUSED_P(enc);
  while (*fromP < fromLim && *toP < toLim)
    *(*toP)++ = (unsigned char)*(*fromP)++;

  if ((*toP == toLim) && (*fromP < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}